

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMultiCond.cpp
# Opt level: O1

void __thiscall
Hpipe::InstructionMultiCond::optimize_conditions
          (InstructionMultiCond *this,PtrPool<Hpipe::Instruction,_32> *inst_pool)

{
  pointer pCVar1;
  pointer pdVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pRVar5;
  ulong uVar6;
  mapped_type_conflict *pmVar7;
  Instruction *pIVar8;
  long lVar9;
  uint uVar10;
  Vec<Hpipe::BranchSet::Range> *__range1;
  uint i;
  ulong uVar11;
  Range *range;
  pointer pRVar12;
  Transition *t;
  pointer pTVar13;
  double dVar14;
  Vec<Hpipe::BranchSet::Range> ranges;
  map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
  nb_ranges;
  BranchSet best_bs;
  Instruction *inst [256];
  vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_> local_8b8;
  undefined1 local_8a0 [8];
  _Rb_tree_node_base _Stack_898;
  size_t local_878;
  vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_> local_870;
  AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete> local_858;
  Cond local_848;
  long local_828 [256];
  
  if ((this->super_Instruction).op_id != Instruction::cur_op_id) {
    (this->super_Instruction).op_id = Instruction::cur_op_id;
    memset(local_828,0,0x800);
    pCVar1 = (this->conds).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
             super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(this->conds).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                  super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar1;
    if (lVar9 != 0) {
      pTVar13 = (this->super_Instruction).next.
                super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = 0;
      do {
        uVar11 = 0;
        do {
          if ((pCVar1[uVar6].p.super__Base_bitset<4UL>._M_w[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) !=
              0) {
            local_828[uVar11] = (long)pTVar13[uVar6].inst;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x100);
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (uVar6 < (ulong)(lVar9 >> 5));
    }
    local_8b8.super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
    _M_impl.super__Vector_impl_data._M_start = (Range *)0x0;
    local_8b8.super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
    _M_impl.super__Vector_impl_data._M_finish = (Range *)0x0;
    local_8b8.super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (Range *)0x0;
    uVar6 = 0;
    do {
      if (local_828[uVar6] != 0) goto LAB_0016de58;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x100);
    uVar6 = 0x100;
LAB_0016de58:
    _Stack_898._M_left = (_Base_ptr)0x0;
    uVar10 = (uint)uVar6;
    if (uVar10 < 0xff) {
      uVar11 = (uVar6 & 0xffffffff) + 1;
      do {
        if ((Instruction *)local_828[uVar11] != (Instruction *)0x0) {
          uVar10 = (uint)uVar6;
          pIVar8 = (Instruction *)local_828[(int)uVar10];
          if ((Instruction *)local_828[uVar11] != pIVar8) {
            local_8a0._4_4_ = (undefined4)uVar11;
            _Stack_898._M_parent = (_Base_ptr)0x0;
            local_8a0._0_4_ = uVar10;
            _Stack_898._0_8_ = pIVar8;
            if (local_8b8.
                super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_8b8.
                super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
              _M_realloc_insert<Hpipe::BranchSet::Range>
                        (&local_8b8,
                         (iterator)
                         local_8b8.
                         super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(Range *)local_8a0);
            }
            else {
              (local_8b8.
               super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
               ._M_impl.super__Vector_impl_data._M_finish)->name = (char *)0x0;
              (local_8b8.
               super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
               ._M_impl.super__Vector_impl_data._M_finish)->freq = (double)_Stack_898._M_left;
              (local_8b8.
               super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
               ._M_impl.super__Vector_impl_data._M_finish)->beg = uVar10;
              (local_8b8.
               super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
               ._M_impl.super__Vector_impl_data._M_finish)->end = local_8a0._4_4_;
              (local_8b8.
               super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
               ._M_impl.super__Vector_impl_data._M_finish)->inst = pIVar8;
              local_8b8.
              super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_8b8.
                   super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            _Stack_898._M_left = (_Base_ptr)0x0;
            uVar6 = uVar11 & 0xffffffff;
          }
        }
        uVar10 = (uint)uVar6;
        pdVar2 = (this->super_Instruction).freq.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        if ((this->super_Instruction).freq.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish == pdVar2) {
          dVar14 = 0.0;
        }
        else {
          dVar14 = pdVar2[uVar11];
        }
        _Stack_898._M_left = (_Base_ptr)((double)_Stack_898._M_left + dVar14);
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x100);
    }
    if (uVar10 != 0x100) {
      local_8a0._4_4_ = 0x100;
      _Stack_898._0_8_ = local_828[(int)uVar10];
      _Stack_898._M_parent = (_Base_ptr)0x0;
      local_8a0._0_4_ = uVar10;
      if (local_8b8.
          super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_8b8.
          super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
        _M_realloc_insert<Hpipe::BranchSet::Range>
                  (&local_8b8,
                   (iterator)
                   local_8b8.
                   super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(Range *)local_8a0);
      }
      else {
        (local_8b8.
         super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
         _M_impl.super__Vector_impl_data._M_finish)->name = (char *)0x0;
        (local_8b8.
         super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
         _M_impl.super__Vector_impl_data._M_finish)->freq = (double)_Stack_898._M_left;
        (local_8b8.
         super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
         _M_impl.super__Vector_impl_data._M_finish)->beg = uVar10;
        (local_8b8.
         super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
         _M_impl.super__Vector_impl_data._M_finish)->end = 0x100;
        (local_8b8.
         super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
         _M_impl.super__Vector_impl_data._M_finish)->inst = (Instruction *)_Stack_898._0_8_;
        local_8b8.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_8b8.
             super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    pRVar5 = local_8b8.
             super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    _Stack_898._M_left = &_Stack_898;
    _Stack_898._0_8_ = _Stack_898._0_8_ & 0xffffffff00000000;
    _Stack_898._M_parent = (_Base_ptr)0x0;
    local_878 = 0;
    _Stack_898._M_right = _Stack_898._M_left;
    if (local_8b8.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_8b8.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pRVar12 = local_8b8.
                super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pmVar7 = std::
                 map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                 ::operator[]((map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                               *)local_8a0,&pRVar12->inst);
        *pmVar7 = *pmVar7 + 1.0;
        pRVar12 = pRVar12 + 1;
      } while (pRVar12 != pRVar5);
    }
    pRVar5 = local_8b8.
             super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_8b8.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_8b8.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pRVar12 = local_8b8.
                super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pmVar7 = std::
                 map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                 ::operator[]((map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                               *)local_8a0,&pRVar12->inst);
        pRVar12->freq = 0.001 / *pmVar7 + pRVar12->freq;
        pRVar12 = pRVar12 + 1;
      } while (pRVar12 != pRVar5);
    }
    std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::vector
              (&local_870,&local_8b8);
    BranchSet::BranchSet((BranchSet *)&local_858,(Vec<Hpipe::BranchSet::Range> *)&local_870);
    if (local_870.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_870.
                      super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_870.
                            super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_870.
                            super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    Cond::Cond(&local_848);
    pIVar8 = InstructionCond::make_cond
                       (local_858.data,inst_pool,&local_848,(this->super_Instruction).in_a_cycle,
                        (this->super_Instruction).mark,this->off_data);
    Instruction::repl_in_preds(&this->super_Instruction,pIVar8);
    pTVar3 = (this->super_Instruction).next.
             super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar13 = (this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_start; pTVar13 != pTVar3; pTVar13 = pTVar13 + 1) {
      pIVar8 = pTVar13->inst;
      pTVar4 = (pIVar8->prev).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = (long)(pIVar8->prev).
                    super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                    super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar4;
      if (lVar9 != 0) {
        uVar6 = (lVar9 >> 3) * -0x3333333333333333;
        uVar10 = 1;
        uVar11 = 0;
        do {
          if ((InstructionMultiCond *)pTVar4[uVar11].inst == this) {
            std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::_M_erase
                      (&(pIVar8->prev).
                        super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>,
                       pTVar4 + uVar11,(pTVar4 + uVar11)._M_current + 1);
            break;
          }
          uVar11 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
        } while (uVar11 <= uVar6 && uVar6 - uVar11 != 0);
      }
    }
    pTVar3 = (this->super_Instruction).next.
             super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar13 = (this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_start; pTVar13 != pTVar3; pTVar13 = pTVar13 + 1) {
      (*pTVar13->inst->_vptr_Instruction[0xe])(pTVar13->inst,inst_pool);
    }
    AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::~AutoPtr(&local_858);
    std::
    _Rb_tree<Hpipe::Instruction_*,_std::pair<Hpipe::Instruction_*const,_double>,_std::_Select1st<std::pair<Hpipe::Instruction_*const,_double>_>,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
    ::~_Rb_tree((_Rb_tree<Hpipe::Instruction_*,_std::pair<Hpipe::Instruction_*const,_double>,_std::_Select1st<std::pair<Hpipe::Instruction_*const,_double>_>,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                 *)local_8a0);
    if (local_8b8.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_start != (Range *)0x0) {
      operator_delete(local_8b8.
                      super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_8b8.
                            super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_8b8.
                            super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void InstructionMultiCond::optimize_conditions( PtrPool<Instruction> &inst_pool ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    // char => instruction
    Instruction *inst[ 256 ];
    for( unsigned i = 0; i < 256; ++i )
        inst[ i ] = 0;
    for( unsigned n = 0; n < conds.size(); ++n )
        for( unsigned i = 0; i < 256; ++i )
            if ( conds[ n ][ i ] )
                inst[ i ] = next[ n ].inst;

    // input for BranchSet
    Vec<BranchSet::Range> ranges;
    double cum_freq = 0;
    int o = 0;
    while ( o < 256 and not inst[ o ] )
        ++o;
    for( int i = o + 1; i < 256; ++i ) {
        if ( inst[ i ] and inst[ i ] != inst[ o ] ) {
            ranges.emplace_back( BranchSet::Range{ o, i, inst[ o ], nullptr, cum_freq } );
            cum_freq = 0;
            o = i;
        }
        cum_freq += freq.size() ? freq[ i ] : 0;
    }
    if ( o != 256 )
        ranges.emplace_back( BranchSet::Range{ o, 256, inst[ o ], nullptr, cum_freq } );

    // to avoid freq 0
    std::map<Instruction *,double> nb_ranges;
    for( BranchSet::Range &range : ranges )
        ++nb_ranges[ range.inst ];
    for( BranchSet::Range &range : ranges )
        range.freq += 1e-3 / nb_ranges[ range.inst ];

    // if succession of cond seams to be a better solution, use them
    BranchSet best_bs( ranges );
    repl_in_preds( InstructionCond::make_cond( best_bs.root.ptr(), inst_pool, {}, in_a_cycle, mark, off_data ) );
    for( Transition &t : next )
        t.inst->prev.remove_first_checking( [&]( Transition &p ) { return p.inst == this; } );

    // following conditions
    for( Transition &t : next )
        t.inst->optimize_conditions( inst_pool );
}